

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_text_calculate_text_bounds
                  (nk_user_font *font,char *begin,int byte_len,float row_height,char **remaining,
                  nk_vec2 *out_offset,int *glyphs,int op)

{
  nk_vec2 nVar1;
  float local_70;
  int local_60;
  nk_rune local_5c;
  int text_len;
  nk_rune unicode;
  int glyph_len;
  float glyph_width;
  float line_width;
  nk_vec2 text_size;
  float line_height;
  int *glyphs_local;
  nk_vec2 *out_offset_local;
  char **remaining_local;
  float row_height_local;
  int byte_len_local;
  char *begin_local;
  nk_user_font *font_local;
  
  text_size.x = row_height;
  unique0x1000017f = glyphs;
  _glyph_width = nk_vec2(0.0,0.0);
  glyph_len = 0;
  text_len = 0;
  local_5c = 0;
  local_60 = 0;
  if (((begin == (char *)0x0) || (byte_len < 1)) || (font == (nk_user_font *)0x0)) {
    font_local = (nk_user_font *)nk_vec2(0.0,row_height);
  }
  else {
    text_len = nk_utf_decode(begin,&local_5c,byte_len);
    if (text_len == 0) {
      font_local = (nk_user_font *)_glyph_width;
    }
    else {
      unicode = (nk_rune)(*font->width)(font->userdata,font->height,begin,text_len);
      *stack0xffffffffffffffc0 = 0;
      while (local_60 < byte_len && text_len != 0) {
        if (local_5c == 10) {
          if ((float)glyph_len <= glyph_width) {
            local_70 = glyph_width;
          }
          else {
            local_70 = (float)glyph_len;
          }
          line_width = text_size.x + line_width;
          glyph_width = local_70;
          glyph_len = 0;
          *stack0xffffffffffffffc0 = *stack0xffffffffffffffc0 + 1;
          if (op == 1) break;
          local_60 = local_60 + 1;
          text_len = nk_utf_decode(begin + local_60,&local_5c,byte_len - local_60);
        }
        else if (local_5c == 0xd) {
          local_60 = local_60 + 1;
          *stack0xffffffffffffffc0 = *stack0xffffffffffffffc0 + 1;
          text_len = nk_utf_decode(begin + local_60,&local_5c,byte_len - local_60);
        }
        else {
          *stack0xffffffffffffffc0 = *stack0xffffffffffffffc0 + 1;
          local_60 = text_len + local_60;
          glyph_len = (int)((float)unicode + (float)glyph_len);
          text_len = nk_utf_decode(begin + local_60,&local_5c,byte_len - local_60);
          unicode = (nk_rune)(*font->width)(font->userdata,font->height,begin + local_60,text_len);
        }
      }
      if (glyph_width < (float)glyph_len) {
        glyph_width = (float)glyph_len;
      }
      if (out_offset != (nk_vec2 *)0x0) {
        nVar1 = nk_vec2((float)glyph_len,line_width + text_size.x);
        *out_offset = nVar1;
      }
      if ((0.0 < (float)glyph_len) || ((line_width == 0.0 && (!NAN(line_width))))) {
        line_width = text_size.x + line_width;
      }
      if (remaining != (char **)0x0) {
        *remaining = begin + local_60;
      }
      font_local = (nk_user_font *)_glyph_width;
    }
  }
  return (nk_vec2)font_local;
}

Assistant:

NK_LIB struct nk_vec2
nk_text_calculate_text_bounds(const struct nk_user_font *font,
    const char *begin, int byte_len, float row_height, const char **remaining,
    struct nk_vec2 *out_offset, int *glyphs, int op)
{
    float line_height = row_height;
    struct nk_vec2 text_size = nk_vec2(0,0);
    float line_width = 0.0f;

    float glyph_width;
    int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    if (!begin || byte_len <= 0 || !font)
        return nk_vec2(0,row_height);

    glyph_len = nk_utf_decode(begin, &unicode, byte_len);
    if (!glyph_len) return text_size;
    glyph_width = font->width(font->userdata, font->height, begin, glyph_len);

    *glyphs = 0;
    while ((text_len < byte_len) && glyph_len) {
        if (unicode == '\n') {
            text_size.x = NK_MAX(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0;
            *glyphs+=1;
            if (op == NK_STOP_ON_NEW_LINE)
                break;

            text_len++;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        if (unicode == '\r') {
            text_len++;
            *glyphs+=1;
            glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
            continue;
        }

        *glyphs = *glyphs + 1;
        text_len += glyph_len;
        line_width += (float)glyph_width;
        glyph_len = nk_utf_decode(begin + text_len, &unicode, byte_len-text_len);
        glyph_width = font->width(font->userdata, font->height, begin+text_len, glyph_len);
        continue;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;
    if (out_offset)
        *out_offset = nk_vec2(line_width, text_size.y + line_height);
    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;
    if (remaining)
        *remaining = begin+text_len;
    return text_size;
}